

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O2

void __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
::resetWith(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
            *this,SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
                  *other)

{
  shared_ptr<supermap::io::FileManager> thisFileManager;
  path local_b0;
  path local_88;
  string local_60;
  string local_40;
  
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  ::operator=(&(this->
               super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
               ).
               super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
               .register_,
              &(other->
               super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
               ).
               super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
               .register_);
  getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
                  *)&thisFileManager);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>>
  ::getStorageFilePath_abi_cxx11_
            (&local_40,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>>
              *)other);
  std::filesystem::__cxx11::path::path(&local_88,&local_40,auto_format);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>>
  ::getStorageFilePath_abi_cxx11_
            (&local_60,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<2ul>>>>
              *)this);
  std::filesystem::__cxx11::path::path(&local_b0,&local_60,auto_format);
  (*(thisFileManager.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_FileManager[4])
            (thisFileManager.
             super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_88,&local_b0);
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::__cxx11::string::~string((string *)&local_60);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&thisFileManager.
              super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

virtual void resetWith(SingleFileIndexedStorage<T, IndexT, RegisterInfo> &&other) noexcept {
        getRegister() = std::move(other.getRegister());
        auto thisFileManager = getFileManager();
        assert(other.getFileManager() == thisFileManager);
        thisFileManager->swap(other.getStorageFilePath(), getStorageFilePath());
    }